

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.c
# Opt level: O0

void mslab_free(mempool *pool,mslab *slab,void *ptr)

{
  int iVar1;
  rlist *prVar2;
  mslab *pmVar3;
  unsigned_long _zzq_result_1;
  unsigned_long _zzq_args_1 [6];
  unsigned_long _zzq_result;
  unsigned_long _zzq_args [6];
  void *ptr_local;
  mslab *slab_local;
  mempool *pool_local;
  
  *(void **)ptr = slab->free_list;
  slab->free_list = ptr;
  slab->nfree = slab->nfree + 1;
  if (((slab->in_hot_slabs & 1U) == 0) && (pool->objcount >> 3 <= slab->nfree)) {
    prVar2 = &slab->next_in_cold;
    prVar2->prev->next = (slab->next_in_cold).next;
    ((slab->next_in_cold).next)->prev = prVar2->prev;
    (slab->next_in_cold).next = prVar2;
    prVar2->prev = prVar2;
    mslab_tree_insert(&pool->hot_slabs,slab);
    slab->in_hot_slabs = true;
    if ((pool->first_hot_slab == (mslab *)0x0) ||
       (iVar1 = mslab_cmp(pool->first_hot_slab,slab), iVar1 == 1)) {
      pool->first_hot_slab = slab;
    }
  }
  else if (slab->nfree == 1) {
    prVar2 = &slab->next_in_cold;
    prVar2->prev = &pool->cold_slabs;
    (slab->next_in_cold).next = (pool->cold_slabs).next;
    prVar2->prev->next = prVar2;
    ((slab->next_in_cold).next)->prev = prVar2;
  }
  else if (slab->nfree == pool->objcount) {
    if (slab == pool->first_hot_slab) {
      pmVar3 = mslab_tree_next(&pool->hot_slabs,slab);
      pool->first_hot_slab = pmVar3;
    }
    mslab_tree_remove(&pool->hot_slabs,slab);
    slab->in_hot_slabs = false;
    if (slab < pool->spare) {
      mempool_free_spare_slab(pool);
      pool->spare = slab;
    }
    else if (pool->spare == (mslab *)0x0) {
      pool->spare = slab;
    }
    else {
      prVar2 = &(slab->slab).next_in_list;
      prVar2->prev->next = (slab->slab).next_in_list.next;
      ((slab->slab).next_in_list.next)->prev = prVar2->prev;
      (slab->slab).next_in_list.next = prVar2;
      prVar2->prev = prVar2;
      (pool->slabs).stats.total = (pool->slabs).stats.total - (slab->slab).size;
      slab_put_with_order(pool->cache,&slab->slab);
    }
  }
  return;
}

Assistant:

void
mslab_free(struct mempool *pool, struct mslab *slab, void *ptr)
{
	/*
	 * Put object to garbage list.
	 * In case when pool objsize is not aligned sizeof(intptr_t) boundary
	 * we can't use *(void **)ptr = slab->free_list construction,
	 * because ptr has not necessary aligment. memcpy can work
	 * with misaligned address.
	 */
	memcpy(ptr, &slab->free_list, sizeof(void *));
	slab->free_list = ptr;
	VALGRIND_FREELIKE_BLOCK(ptr, 0);
	VALGRIND_MAKE_MEM_DEFINED(ptr, sizeof(void *));

	slab->nfree++;

	if (slab->in_hot_slabs == false &&
	    slab->nfree >= (pool->objcount >> MAX_COLD_FRACTION_LB)) {
		/**
		 * Add this slab to the rbtree which contains
		 * sufficiently fragmented slabs.
		 */
		rlist_del_entry(slab, next_in_cold);
		mslab_tree_insert(&pool->hot_slabs, slab);
		slab->in_hot_slabs = true;
		/*
		 * Update first_hot_slab pointer if the newly
		 * added tree node is the leftmost.
		 */
		if (pool->first_hot_slab == NULL ||
		    mslab_cmp(pool->first_hot_slab, slab) == 1) {
			pool->first_hot_slab = slab;
		}
	} else if (slab->nfree == 1) {
		rlist_add_entry(&pool->cold_slabs, slab, next_in_cold);
	} else if (slab->nfree == pool->objcount) {
		/** Free the slab. */
		if (slab == pool->first_hot_slab) {
			pool->first_hot_slab =
				mslab_tree_next(&pool->hot_slabs, slab);
		}
		mslab_tree_remove(&pool->hot_slabs, slab);
		slab->in_hot_slabs = false;
		if (pool->spare > slab) {
			mempool_free_spare_slab(pool);
			pool->spare = slab;
		} else if (pool->spare) {
			slab_list_del(&pool->slabs, &slab->slab,
				      next_in_list);
			slab_put_with_order(pool->cache, &slab->slab);
		} else {
			pool->spare = slab;
		}
	}
}